

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

void __thiscall QCborValue::toCbor(QCborValue *this,QCborStreamWriter *writer,EncodingOptions opt)

{
  uint uVar1;
  QCborContainerPrivate *d;
  qsizetype idx;
  
  uVar1 = *(uint *)(this + 0x10);
  if (((uVar1 & 0xffffffdf) == 0x80) || (uVar1 == 0xc0 || 0xffff < (int)uVar1)) {
    d = *(QCborContainerPrivate **)(this + 8);
    idx = -(long)(int)uVar1;
  }
  else {
    d = *(QCborContainerPrivate **)(this + 8);
    if (d == (QCborContainerPrivate *)0x0) {
      if ((uVar1 & 0xffffff00) == 0x100) {
        QCborStreamWriter::append(writer,(QCborSimpleType)uVar1);
        return;
      }
      if ((int)uVar1 < 0x60) {
        if (uVar1 == 0) {
          QCborStreamWriter::append(writer,*(qint64 *)this);
          return;
        }
        if (uVar1 == 0x40) {
          QCborStreamWriter::appendByteString(writer,"",0);
          return;
        }
      }
      else {
        if (uVar1 == 0x60) {
          QCborStreamWriter::appendTextString(writer,"",0);
          return;
        }
        if (uVar1 == 0x202) {
          writeDoubleToCbor(writer,*(double *)this,opt);
          return;
        }
      }
      return;
    }
    idx = *(qsizetype *)this;
  }
  encodeToCbor(writer,d,idx,opt);
  return;
}

Assistant:

Q_NEVER_INLINE void QCborValue::toCbor(QCborStreamWriter &writer, EncodingOptions opt) const
{
    if (isContainer() || isTag())
        return encodeToCbor(writer, container, -type(), opt);
    if (container)
        return encodeToCbor(writer, container, n, opt);

    // very simple types
    if (isSimpleType())
        return writer.append(toSimpleType());

    switch (type()) {
    case Integer:
        return writer.append(n);

    case Double:
        return writeDoubleToCbor(writer, fp_helper(), opt);

    case Invalid:
        return;

    case SimpleType:
    case False:
    case True:
    case Null:
    case Undefined:
        // handled by "if (isSimpleType())"
        Q_UNREACHABLE();
        break;

    case ByteArray:
        // Byte array with no container is empty
        return writer.appendByteString("", 0);

    case String:
        // String with no container is empty
        return writer.appendTextString("", 0);

    case Array:
    case Map:
    case Tag:
        // handled by "if (isContainer() || isTag())"
        Q_UNREACHABLE();
        break;

    case DateTime:
    case Url:
    case RegularExpression:
    case Uuid:
        // not possible
        Q_UNREACHABLE();
        break;
    }
}